

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detectionoutput.cpp
# Opt level: O0

int __thiscall
ncnn::DetectionOutput::forward
          (DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  value_type vVar1;
  __normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
  __last;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> __last_00;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  reference this_00;
  reference pvVar5;
  reference pvVar6;
  float *pfVar7;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  double dVar8;
  float *outptr;
  float score_1;
  BBoxRect *r;
  int i_3;
  Mat *top_blob;
  int num_detected;
  vector<float,_std::allocator<float>_> *class_bbox_scores_1;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *class_bbox_rects_1;
  int i_2;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  int z;
  int j_1;
  vector<int,_std::allocator<int>_> picked;
  BBoxRect c;
  float *bbox_1;
  float score;
  int j;
  vector<float,_std::allocator<float>_> class_bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> class_bbox_rects;
  int i_1;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  all_class_bbox_scores;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  all_class_bbox_rects;
  float bbox_h;
  float bbox_w;
  float bbox_cy;
  float bbox_cx;
  float pb_cy;
  float pb_cx;
  float pb_h;
  float pb_w;
  float *bbox;
  float *var;
  float *pb;
  float *loc;
  int i;
  float *variance_ptr;
  float *priorbox_ptr;
  float *location_ptr;
  Mat bboxes;
  int num_prior;
  Mat *priorbox;
  Mat *confidence;
  Mat *location;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  int iVar9;
  value_type *in_stack_fffffffffffffcf8;
  iterator in_stack_fffffffffffffd00;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *in_stack_fffffffffffffd08;
  iterator in_stack_fffffffffffffd10;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd3c;
  __normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
  in_stack_fffffffffffffd40;
  const_iterator in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd84;
  float nms_threshold;
  Mat *this_01;
  int local_24c;
  int local_1d4;
  vector<float,_std::allocator<float>_> local_1d0;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> local_1b8;
  int local_1a0;
  int local_19c;
  vector<float,_std::allocator<float>_> local_198;
  float local_17c;
  float local_178;
  float local_174;
  float local_170;
  int local_16c;
  BBoxRect *local_168;
  float local_160;
  int local_15c;
  vector<float,_std::allocator<float>_> local_158;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> local_140;
  int local_124;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_120;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  local_108;
  float local_f0;
  float local_ec;
  float local_e8;
  float local_e4;
  float local_e0;
  float local_dc;
  float local_d8;
  float local_d4;
  float *local_d0;
  float *local_c8;
  float *local_c0;
  float *local_b8;
  int local_ac;
  float *local_a8;
  float *local_a0;
  float *local_98;
  undefined4 local_90;
  Mat local_80;
  int local_44;
  const_reference local_40;
  const_reference local_38;
  const_reference local_30;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_38 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
  local_40 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,2);
  local_44 = local_40->w;
  if (local_44 < 0) {
    local_44 = local_44 + 3;
  }
  local_44 = local_44 >> 2;
  this_01 = &local_80;
  Mat::Mat(this_01);
  Mat::create((Mat *)in_stack_fffffffffffffd10._M_current,
              (int)((ulong)in_stack_fffffffffffffd08 >> 0x20),(int)in_stack_fffffffffffffd08,
              (size_t)in_stack_fffffffffffffd00._M_current,(Allocator *)in_stack_fffffffffffffcf8);
  bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
  nms_threshold = (float)CONCAT13(bVar2,(int3)in_stack_fffffffffffffd84);
  if (bVar2) {
    local_4 = -100;
    local_90 = 1;
  }
  else {
    local_98 = Mat::operator_cast_to_float_(local_30);
    local_a0 = Mat::row(local_40,0);
    local_a8 = Mat::row(local_40,1);
    for (local_ac = 0; local_ac < local_44; local_ac = local_ac + 1) {
      local_b8 = local_98 + (local_ac << 2);
      local_c0 = local_a0 + (local_ac << 2);
      local_c8 = local_a8 + (local_ac << 2);
      local_d0 = Mat::row(&local_80,local_ac);
      local_d4 = local_c0[2] - *local_c0;
      local_d8 = local_c0[3] - local_c0[1];
      local_dc = (*local_c0 + local_c0[2]) * 0.5;
      local_e0 = (local_c0[1] + local_c0[3]) * 0.5;
      local_e4 = *local_c8 * *local_b8 * local_d4 + local_dc;
      local_e8 = local_c8[1] * local_b8[1] * local_d8 + local_e0;
      dVar8 = std::exp((double)(ulong)(uint)(local_c8[2] * local_b8[2]));
      local_ec = SUB84(dVar8,0) * local_d4;
      dVar8 = std::exp((double)(ulong)(uint)(local_c8[3] * local_b8[3]));
      local_f0 = SUB84(dVar8,0) * local_d8;
      *local_d0 = local_e4 - local_ec * 0.5;
      local_d0[1] = local_e8 - local_f0 * 0.5;
      local_d0[2] = local_e4 + local_ec * 0.5;
      local_d0[3] = local_e8 + local_f0 * 0.5;
    }
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)0x14d528);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)0x14d535);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)in_stack_fffffffffffffd10._M_current,(size_type)in_stack_fffffffffffffd08);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)in_stack_fffffffffffffd10._M_current,(size_type)in_stack_fffffffffffffd08);
    for (local_124 = 1;
        local_124 <
        *(int *)&in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish; local_124 = local_124 + 1) {
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::vector
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)0x14d5a1);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x14d5ae);
      for (local_15c = 0; local_15c < local_44; local_15c = local_15c + 1) {
        in_stack_fffffffffffffd48._M_current =
             (BBoxRect *)
             Mat::operator[](local_38,local_15c *
                                      *(int *)&in_RDI[5].
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish + local_124);
        local_160 = (in_stack_fffffffffffffd48._M_current)->xmin;
        if (*(float *)&in_RDI[6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start <= local_160 &&
            local_160 !=
            *(float *)&in_RDI[6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) {
          in_stack_fffffffffffffd40._M_current = (BBoxRect *)Mat::row(&local_80,local_15c);
          local_17c = (in_stack_fffffffffffffd40._M_current)->xmin;
          local_178 = (in_stack_fffffffffffffd40._M_current)->ymin;
          local_174 = (in_stack_fffffffffffffd40._M_current)->xmax;
          local_170 = (in_stack_fffffffffffffd40._M_current)->ymax;
          local_16c = local_124;
          local_168 = in_stack_fffffffffffffd40._M_current;
          std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                    ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                     in_stack_fffffffffffffd00._M_current,in_stack_fffffffffffffcf8);
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd00._M_current,
                     &in_stack_fffffffffffffcf8->xmin);
        }
      }
      qsort_descent_inplace<ncnn::BBoxRect>
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffd00._M_current,
                 (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffcf8);
      in_stack_fffffffffffffd3c =
           *(int *)&in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      sVar3 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::size(&local_140);
      if (in_stack_fffffffffffffd3c < (int)sVar3) {
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                   in_stack_fffffffffffffd10._M_current,(size_type)in_stack_fffffffffffffd08);
        std::vector<float,_std::allocator<float>_>::resize
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd10._M_current,
                   (size_type)in_stack_fffffffffffffd08);
      }
      in_stack_fffffffffffffd30 = &local_198;
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x14d7ca);
      nms_sorted_bboxes((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)this_01,in_RDI,
                        nms_threshold);
      local_19c = 0;
      while( true ) {
        iVar9 = local_19c;
        sVar3 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)&local_198);
        if ((int)sVar3 <= iVar9) break;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&local_198,(long)local_19c);
        local_1a0 = *pvVar4;
        std::
        vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
        ::operator[](&local_108,(long)local_124);
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
                  (&local_140,(long)local_1a0);
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                   in_stack_fffffffffffffd00._M_current,in_stack_fffffffffffffcf8);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::operator[](&local_120,(long)local_124);
        std::vector<float,_std::allocator<float>_>::operator[](&local_158,(long)local_1a0);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd00._M_current,
                   &in_stack_fffffffffffffcf8->xmin);
        local_19c = local_19c + 1;
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd00._M_current);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd00._M_current);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~vector
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffd00._M_current);
    }
    std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::vector
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)0x14d95e);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x14d96b);
    for (local_1d4 = 1;
        local_1d4 <
        *(int *)&in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish; local_1d4 = local_1d4 + 1) {
      std::
      vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ::operator[](&local_108,(long)local_1d4);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::operator[](&local_120,(long)local_1d4);
      in_stack_fffffffffffffd08 = &local_1b8;
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::end
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffce8);
      __gnu_cxx::
      __normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>
      ::__normal_iterator<ncnn::BBoxRect*>
                ((__normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
                  *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                 (__normal_iterator<ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
                  *)in_stack_fffffffffffffce8);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::begin
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffce8);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::end
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffce8);
      __last._M_current._4_4_ = in_stack_fffffffffffffd3c;
      __last._M_current._0_4_ = in_stack_fffffffffffffd38;
      in_stack_fffffffffffffd10 =
           std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
           insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>,void>
                     ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                      in_stack_fffffffffffffd30,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                      __last);
      in_stack_fffffffffffffcf8 = (value_type *)&local_1d0;
      std::vector<float,_std::allocator<float>_>::end(in_stack_fffffffffffffce8);
      __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
      __normal_iterator<float*>
                ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                 (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 in_stack_fffffffffffffce8);
      std::vector<float,_std::allocator<float>_>::begin(in_stack_fffffffffffffce8);
      std::vector<float,_std::allocator<float>_>::end(in_stack_fffffffffffffce8);
      __last_00._M_current._4_4_ = in_stack_fffffffffffffd3c;
      __last_00._M_current._0_4_ = in_stack_fffffffffffffd38;
      in_stack_fffffffffffffd00 =
           std::vector<float,std::allocator<float>>::
           insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
                     (in_stack_fffffffffffffd30,(const_iterator)in_stack_fffffffffffffd48._M_current
                      ,(__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                        )in_stack_fffffffffffffd40._M_current,__last_00);
    }
    qsort_descent_inplace<ncnn::BBoxRect>
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
               in_stack_fffffffffffffd00._M_current,
               (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffcf8);
    iVar9 = *(int *)((long)&in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4);
    sVar3 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::size(&local_1b8);
    if (iVar9 < (int)sVar3) {
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffd10._M_current,(size_type)in_stack_fffffffffffffd08);
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd10._M_current,
                 (size_type)in_stack_fffffffffffffd08);
    }
    sVar3 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::size(&local_1b8);
    this_00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    Mat::create((Mat *)in_stack_fffffffffffffd10._M_current,
                (int)((ulong)in_stack_fffffffffffffd08 >> 0x20),(int)in_stack_fffffffffffffd08,
                (size_t)in_stack_fffffffffffffd00._M_current,(Allocator *)in_stack_fffffffffffffcf8)
    ;
    bVar2 = Mat::empty((Mat *)CONCAT44(iVar9,in_stack_fffffffffffffcf0));
    if (bVar2) {
      local_4 = -100;
    }
    else {
      for (local_24c = 0; local_24c < (int)sVar3; local_24c = local_24c + 1) {
        pvVar5 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
                           (&local_1b8,(long)local_24c);
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](&local_1d0,(long)local_24c);
        vVar1 = *pvVar6;
        pfVar7 = Mat::row(this_00,local_24c);
        *pfVar7 = (float)pvVar5->label;
        pfVar7[1] = vVar1;
        pfVar7[2] = pvVar5->xmin;
        pfVar7[3] = pvVar5->ymin;
        pfVar7[4] = pvVar5->xmax;
        pfVar7[5] = pvVar5->ymax;
      }
      local_4 = 0;
    }
    local_90 = 1;
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd00._M_current);
    std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~vector
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
               in_stack_fffffffffffffd00._M_current);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *)in_stack_fffffffffffffd00._M_current);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
               *)in_stack_fffffffffffffd00._M_current);
  }
  Mat::~Mat((Mat *)0x14dde7);
  return local_4;
}

Assistant:

int DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& location = bottom_blobs[0];
    const Mat& confidence = bottom_blobs[1];
    const Mat& priorbox = bottom_blobs[2];

    const int num_prior = priorbox.w / 4;

    // apply location with priorbox
    Mat bboxes;
    bboxes.create(4, num_prior, 4u, opt.workspace_allocator);
    if (bboxes.empty())
        return -100;

    const float* location_ptr = location;
    const float* priorbox_ptr = priorbox.row(0);
    const float* variance_ptr = priorbox.row(1);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_prior; i++)
    {
        const float* loc = location_ptr + i * 4;
        const float* pb = priorbox_ptr + i * 4;
        const float* var = variance_ptr + i * 4;

        float* bbox = bboxes.row(i);

        // CENTER_SIZE
        float pb_w = pb[2] - pb[0];
        float pb_h = pb[3] - pb[1];
        float pb_cx = (pb[0] + pb[2]) * 0.5f;
        float pb_cy = (pb[1] + pb[3]) * 0.5f;

        float bbox_cx = var[0] * loc[0] * pb_w + pb_cx;
        float bbox_cy = var[1] * loc[1] * pb_h + pb_cy;
        float bbox_w = exp(var[2] * loc[2]) * pb_w;
        float bbox_h = exp(var[3] * loc[3]) * pb_h;

        bbox[0] = bbox_cx - bbox_w * 0.5f;
        bbox[1] = bbox_cy - bbox_h * 0.5f;
        bbox[2] = bbox_cx + bbox_w * 0.5f;
        bbox[3] = bbox_cy + bbox_h * 0.5f;
    }

    // sort and nms for each class
    std::vector< std::vector<BBoxRect> > all_class_bbox_rects;
    std::vector< std::vector<float> > all_class_bbox_scores;
    all_class_bbox_rects.resize(num_class);
    all_class_bbox_scores.resize(num_class);

    // start from 1 to ignore background class
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 1; i < num_class; i++)
    {
        // filter by confidence_threshold
        std::vector<BBoxRect> class_bbox_rects;
        std::vector<float> class_bbox_scores;

        for (int j = 0; j < num_prior; j++)
        {
            float score = confidence[j * num_class + i];

            if (score > confidence_threshold)
            {
                const float* bbox = bboxes.row(j);
                BBoxRect c = { bbox[0], bbox[1], bbox[2], bbox[3], i };
                class_bbox_rects.push_back(c);
                class_bbox_scores.push_back(score);
            }
        }

        // sort inplace
        qsort_descent_inplace(class_bbox_rects, class_bbox_scores);

        // keep nms_top_k
        if (nms_top_k < (int)class_bbox_rects.size())
        {
            class_bbox_rects.resize(nms_top_k);
            class_bbox_scores.resize(nms_top_k);
        }

        // apply nms
        std::vector<int> picked;
        nms_sorted_bboxes(class_bbox_rects, picked, nms_threshold);

        // select
        for (int j = 0; j < (int)picked.size(); j++)
        {
            int z = picked[j];
            all_class_bbox_rects[i].push_back(class_bbox_rects[z]);
            all_class_bbox_scores[i].push_back(class_bbox_scores[z]);
        }
    }

    // gather all class
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (int i = 1; i < num_class; i++)
    {
        const std::vector<BBoxRect>& class_bbox_rects = all_class_bbox_rects[i];
        const std::vector<float>& class_bbox_scores = all_class_bbox_scores[i];

        bbox_rects.insert(bbox_rects.end(), class_bbox_rects.begin(), class_bbox_rects.end());
        bbox_scores.insert(bbox_scores.end(), class_bbox_scores.begin(), class_bbox_scores.end());
    }

    // global sort inplace
    qsort_descent_inplace(bbox_rects, bbox_scores);

    // keep_top_k
    if (keep_top_k < (int)bbox_rects.size())
    {
        bbox_rects.resize(keep_top_k);
        bbox_scores.resize(keep_top_k);
    }

    // fill result
    int num_detected = bbox_rects.size();

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = r.label;
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}